

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O0

void __thiscall
icu_63::FieldPositionIterator::setData
          (FieldPositionIterator *this,UVector32 *adopt,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int local_24;
  int i;
  UErrorCode *status_local;
  UVector32 *adopt_local;
  FieldPositionIterator *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  status_local = (UErrorCode *)adopt;
  if ((UVar1 != '\0') && (adopt != (UVector32 *)0x0)) {
    iVar2 = UVector32::size(adopt);
    if (iVar2 == 0) {
      if (adopt != (UVector32 *)0x0) {
        (*(adopt->super_UObject)._vptr_UObject[1])();
      }
      status_local = (UErrorCode *)0x0;
    }
    else {
      iVar2 = UVector32::size(adopt);
      if (iVar2 % 3 == 0) {
        for (local_24 = 1; iVar2 = UVector32::size(adopt), local_24 < iVar2; local_24 = local_24 + 3
            ) {
          iVar2 = UVector32::elementAti(adopt,local_24);
          iVar3 = UVector32::elementAti(adopt,local_24 + 1);
          if (iVar3 <= iVar2) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
        }
      }
      else {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 == '\0') {
    if (status_local != (UErrorCode *)0x0) {
      (**(code **)(*(undefined8 *)status_local + U_INDEX_OUTOFBOUNDS_ERROR))();
    }
  }
  else {
    if (this->data != (UVector32 *)0x0) {
      (*(this->data->super_UObject)._vptr_UObject[1])();
    }
    this->data = (UVector32 *)status_local;
    iVar2 = 0;
    if (status_local == (UErrorCode *)0x0) {
      iVar2 = -1;
    }
    this->pos = iVar2;
  }
  return;
}

Assistant:

void FieldPositionIterator::setData(UVector32 *adopt, UErrorCode& status) {
  // Verify that adopt has valid data, and update status if it doesn't.
  if (U_SUCCESS(status)) {
    if (adopt) {
      if (adopt->size() == 0) {
        delete adopt;
        adopt = NULL;
      } else if ((adopt->size() % 3) != 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
      } else {
        for (int i = 1; i < adopt->size(); i += 3) {
          if (adopt->elementAti(i) >= adopt->elementAti(i+1)) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
        }
      }
    }
  }

  // We own the data, even if status is in error, so we need to delete it now
  // if we're not keeping track of it.
  if (!U_SUCCESS(status)) {
    delete adopt;
    return;
  }

  delete data;
  data = adopt;
  pos = adopt == NULL ? -1 : 0;
}